

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::StringVector::ByteSizeLong(StringVector *this)

{
  int iVar1;
  string *value;
  size_t sVar2;
  int cached_size;
  int n;
  int i;
  size_t total_size;
  StringVector *this_local;
  
  iVar1 = vector_size(this);
  _n = google::protobuf::internal::FromIntSize(iVar1);
  cached_size = 0;
  iVar1 = vector_size(this);
  for (; cached_size < iVar1; cached_size = cached_size + 1) {
    value = vector_abi_cxx11_(this,cached_size);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value);
    _n = sVar2 + _n;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(_n);
  this->_cached_size_ = iVar1;
  return _n;
}

Assistant:

size_t StringVector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringVector)
  size_t total_size = 0;

  // repeated string vector = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->vector_size());
  for (int i = 0, n = this->vector_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->vector(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}